

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_list(void)

{
  AMQP_VALUE_DATA *pAVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  AMQP_VALUE result;
  
  pAVar1 = REFCOUNT_AMQP_VALUE_DATA_Create();
  if (pAVar1 == (AMQP_VALUE_DATA *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_list",0x4d8,1,"Could not allocate memory for AMQP value");
    }
  }
  else {
    pAVar1->type = AMQP_TYPE_LIST;
    (pAVar1->value).binary_value.length = 0;
    (pAVar1->value).described_value.descriptor = (AMQP_VALUE)0x0;
  }
  return pAVar1;
}

Assistant:

AMQP_VALUE amqpvalue_create_list(void)
{
    AMQP_VALUE result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_150: [If allocating the AMQP_VALUE fails then amqpvalue_create_list shall return NULL.] */
        LogError("Could not allocate memory for AMQP value");
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_149: [amqpvalue_create_list shall return a handle to an AMQP_VALUE that stores a list.] */
        result->type = AMQP_TYPE_LIST;

        /* Codes_SRS_AMQPVALUE_01_151: [The list shall have an initial size of zero.] */
        result->value.list_value.count = 0;
        result->value.list_value.items = NULL;
    }

    return result;
}